

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O2

void nn_surveyor_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_sockbase *self_00;
  
  self_00 = (nn_sockbase *)&self[-5].shutdown_fn;
  if (self == (nn_fsm *)0x0) {
    self_00 = (nn_sockbase *)0x0;
  }
  if (type == -3 && src == -2) {
    nn_timer_stop((nn_timer *)(self_00 + 0x21));
    *(undefined4 *)&self_00[0x20].sock = 6;
  }
  else if (*(int *)&self_00[0x20].sock != 6) {
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&self_00[0x20].sock,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/survey/surveyor.c"
            ,0x150);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_timer_isidle((nn_timer *)(self_00 + 0x21));
  if (iVar1 != 0) {
    *(undefined4 *)&self_00[0x20].sock = 1;
    nn_fsm_stopped_noevent((nn_fsm *)(self_00 + 0x1b));
    nn_sockbase_stopped(self_00);
    return;
  }
  return;
}

Assistant:

static void nn_surveyor_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, fsm);

    if (nn_slow (src== NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_timer_stop (&surveyor->timer);
        surveyor->state = NN_SURVEYOR_STATE_STOPPING;
    }
    if (nn_slow (surveyor->state == NN_SURVEYOR_STATE_STOPPING)) {
        if (!nn_timer_isidle (&surveyor->timer))
            return;
        surveyor->state = NN_SURVEYOR_STATE_IDLE;
        nn_fsm_stopped_noevent (&surveyor->fsm);
        nn_sockbase_stopped (&surveyor->xsurveyor.sockbase);
        return;
    }

    nn_fsm_bad_state(surveyor->state, src, type);
}